

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AtQuantifier
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this)

{
  StandardChars<char16_t> *pSVar1;
  CharCount CVar2;
  int iVar3;
  bool bVar4;
  EncodedChar EVar5;
  int iVar6;
  ulong uVar7;
  
  EVar5 = ECLookahead(this,0);
  if ((ushort)EVar5 - 0x2a < 2) {
    return true;
  }
  if (EVar5 == L'?') {
    return true;
  }
  if (EVar5 == L'{') {
    uVar7 = 1;
    do {
      CVar2 = (CharCount)uVar7;
      uVar7 = (ulong)(CVar2 + 1);
      if (this->inputLim < this->next + uVar7) break;
      pSVar1 = this->standardEncodedChars;
      EVar5 = ECLookahead(this,CVar2);
      bVar4 = StandardChars<char16_t>::IsDigit(pSVar1,EVar5);
    } while (bVar4);
    if ((CVar2 != 1) && (this->next + uVar7 <= this->inputLim)) {
      EVar5 = ECLookahead(this,CVar2);
      if (EVar5 == L'}') {
        return true;
      }
      if (EVar5 == L',') {
        uVar7 = (ulong)(CVar2 + 1);
        if ((this->next + (CVar2 + 2) <= this->inputLim) &&
           (EVar5 = ECLookahead(this,CVar2 + 1), EVar5 == L'}')) {
          return true;
        }
        iVar3 = 0;
        do {
          iVar6 = iVar3;
          CVar2 = (CharCount)uVar7;
          uVar7 = (ulong)(CVar2 + 1);
          if (this->inputLim < this->next + uVar7) break;
          pSVar1 = this->standardEncodedChars;
          EVar5 = ECLookahead(this,CVar2);
          bVar4 = StandardChars<char16_t>::IsDigit(pSVar1,EVar5);
          iVar3 = iVar6 + -1;
        } while (bVar4);
        if ((iVar6 != 0) && (this->next + uVar7 <= this->inputLim)) {
          EVar5 = ECLookahead(this,CVar2);
          return EVar5 == L'}';
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser<P, IsLiteral>::AtQuantifier()
    {
        // Could be terminating 0
        switch (ECLookahead())
        {
        case '*':
        case '+':
        case '?':
            return true;
        case '{':
            {
                CharCount lookahead = 1;
                while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                    lookahead++;
                if (lookahead == 1 || !ECCanConsume(lookahead + 1))
                    return false;
                switch (ECLookahead(lookahead))
                {
                case ',':
                    lookahead++;
                    if (ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}')
                        return true;
                    else
                    {
                        CharCount saved = lookahead;
                        while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                            lookahead++;
                        if (lookahead == saved)
                            return false;
                        return ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}';
                    }
                case '}':
                    return true;
                default:
                    return false;
                }
            }
        default:
            return false;
        }
    }